

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctcp.c
# Opt level: O2

void nn_ctcp_destroy(void *self)

{
  nn_dns_term((nn_dns *)((long)self + 0x7b0));
  nn_stcp_term((nn_stcp *)((long)self + 0x3c0));
  nn_backoff_term((nn_backoff *)((long)self + 0x2c8));
  nn_usock_term((nn_usock *)((long)self + 0x68));
  nn_fsm_term((nn_fsm *)self);
  nn_free(self);
  return;
}

Assistant:

static void nn_ctcp_destroy (void *self)
{
    struct nn_ctcp *ctcp = self;

    nn_dns_term (&ctcp->dns);
    nn_stcp_term (&ctcp->stcp);
    nn_backoff_term (&ctcp->retry);
    nn_usock_term (&ctcp->usock);
    nn_fsm_term (&ctcp->fsm);

    nn_free (ctcp);
}